

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract.h
# Opt level: O1

BinaryOp wasm::Abstract::getBinary(Type type,Op op)

{
  BinaryOp BVar1;
  ulong uVar2;
  undefined *puVar3;
  
  if (6 < type.id) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                  ,0xc6,"BasicType wasm::Type::getBasic() const");
  }
  BVar1 = InvalidBinary;
  switch(type.id & 0xffffffff) {
  case 0:
  case 1:
  case 6:
    goto switchD_006c2f55_caseD_0;
  case 2:
    if (0x1a < op - Add) {
      return InvalidBinary;
    }
    uVar2 = (ulong)(op - Add);
    puVar3 = &DAT_00b70528;
    break;
  case 3:
    if (0x1a < op - Add) {
      return InvalidBinary;
    }
    uVar2 = (ulong)(op - Add);
    puVar3 = &DAT_00b70594;
    break;
  case 4:
    if (0x12 < op - Add) {
      return InvalidBinary;
    }
    uVar2 = (ulong)(op - Add);
    puVar3 = &DAT_00b70600;
    break;
  case 5:
    if (0x12 < op - Add) {
      return InvalidBinary;
    }
    uVar2 = (ulong)(op - Add);
    puVar3 = &DAT_00b7064c;
    break;
  default:
    handle_unreachable("invalid type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/abstract.h"
                       ,0x130);
  }
  BVar1 = *(BinaryOp *)(puVar3 + uVar2 * 4);
switchD_006c2f55_caseD_0:
  return BVar1;
}

Assistant:

inline BinaryOp getBinary(Type type, Op op) {
  switch (type.getBasic()) {
    case Type::i32: {
      switch (op) {
        case Add:
          return AddInt32;
        case Sub:
          return SubInt32;
        case Mul:
          return MulInt32;
        case DivU:
          return DivUInt32;
        case DivS:
          return DivSInt32;
        case RemU:
          return RemUInt32;
        case RemS:
          return RemSInt32;
        case Shl:
          return ShlInt32;
        case ShrU:
          return ShrUInt32;
        case ShrS:
          return ShrSInt32;
        case RotL:
          return RotLInt32;
        case RotR:
          return RotRInt32;
        case And:
          return AndInt32;
        case Or:
          return OrInt32;
        case Xor:
          return XorInt32;
        case Eq:
          return EqInt32;
        case Ne:
          return NeInt32;
        case LtS:
          return LtSInt32;
        case LtU:
          return LtUInt32;
        case LeS:
          return LeSInt32;
        case LeU:
          return LeUInt32;
        case GtS:
          return GtSInt32;
        case GtU:
          return GtUInt32;
        case GeS:
          return GeSInt32;
        case GeU:
          return GeUInt32;
        default:
          return InvalidBinary;
      }
      break;
    }
    case Type::i64: {
      switch (op) {
        case Add:
          return AddInt64;
        case Sub:
          return SubInt64;
        case Mul:
          return MulInt64;
        case DivU:
          return DivUInt64;
        case DivS:
          return DivSInt64;
        case RemU:
          return RemUInt64;
        case RemS:
          return RemSInt64;
        case Shl:
          return ShlInt64;
        case ShrU:
          return ShrUInt64;
        case ShrS:
          return ShrSInt64;
        case RotL:
          return RotLInt64;
        case RotR:
          return RotRInt64;
        case And:
          return AndInt64;
        case Or:
          return OrInt64;
        case Xor:
          return XorInt64;
        case Eq:
          return EqInt64;
        case Ne:
          return NeInt64;
        case LtS:
          return LtSInt64;
        case LtU:
          return LtUInt64;
        case LeS:
          return LeSInt64;
        case LeU:
          return LeUInt64;
        case GtS:
          return GtSInt64;
        case GtU:
          return GtUInt64;
        case GeS:
          return GeSInt64;
        case GeU:
          return GeUInt64;
        default:
          return InvalidBinary;
      }
      break;
    }
    case Type::f32: {
      switch (op) {
        case Add:
          return AddFloat32;
        case Sub:
          return SubFloat32;
        case Mul:
          return MulFloat32;
        case DivU:
          return DivFloat32;
        case DivS:
          return DivFloat32;
        case CopySign:
          return CopySignFloat32;
        case Eq:
          return EqFloat32;
        case Ne:
          return NeFloat32;
        default:
          return InvalidBinary;
      }
      break;
    }
    case Type::f64: {
      switch (op) {
        case Add:
          return AddFloat64;
        case Sub:
          return SubFloat64;
        case Mul:
          return MulFloat64;
        case DivU:
          return DivFloat64;
        case DivS:
          return DivFloat64;
        case CopySign:
          return CopySignFloat64;
        case Eq:
          return EqFloat64;
        case Ne:
          return NeFloat64;
        default:
          return InvalidBinary;
      }
      break;
    }
    case Type::v128:
    case Type::none:
    case Type::unreachable: {
      return InvalidBinary;
    }
  }
  WASM_UNREACHABLE("invalid type");
}